

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O3

cmListFileLexer * cmListFileLexer_New(void)

{
  cmListFileLexer *pcVar1;
  
  pcVar1 = (cmListFileLexer *)calloc(1,0x68);
  if (pcVar1 != (cmListFileLexer *)0x0) {
    pcVar1->line = 1;
    pcVar1->column = 1;
  }
  return pcVar1;
}

Assistant:

cmListFileLexer* cmListFileLexer_New(void)
{
  cmListFileLexer* lexer = (cmListFileLexer*)malloc(sizeof(cmListFileLexer));
  if (!lexer) {
    return 0;
  }
  memset(lexer, 0, sizeof(*lexer));
  lexer->line = 1;
  lexer->column = 1;
  return lexer;
}